

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontTests.cpp
# Opt level: O0

void __thiscall agge::tests::FontTests::MissingGlyphIsReportedAsNull(FontTests *this)

{
  bool bVar1;
  element_type *peVar2;
  pointer ppVar3;
  glyph *local_268;
  glyph *local_248;
  glyph *local_218;
  glyph *local_1e8;
  allocator local_1c9;
  string local_1c8;
  LocationInfo local_1a8;
  glyph *local_180;
  allocator local_171;
  string local_170;
  LocationInfo local_150;
  glyph *local_128;
  allocator local_119;
  string local_118;
  LocationInfo local_f8;
  glyph *local_d0 [3];
  undefined1 local_b8 [8];
  ptr f;
  glyph glyphs [1];
  char_to_index local_78;
  char_to_index indices [1];
  FontTests *this_local;
  _Node_iterator_base<std::pair<const_unsigned_int,_agge::glyph>,_true> local_60;
  iterator i_2;
  _Node_iterator_base<std::pair<const_unsigned_int,_agge::glyph>,_true> local_48;
  _Node_iterator_base<std::pair<const_unsigned_int,_agge::glyph>,_true> local_40;
  iterator i_1;
  _Node_iterator_base<std::pair<const_unsigned_int,_agge::glyph>,_true> local_28;
  _Node_iterator_base<std::pair<const_unsigned_int,_agge::glyph>,_true> local_20;
  iterator i;
  
  local_78.symbol = 0x41;
  local_78.index = 0;
  f.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4026000000000000;
  glyphs[0].metrics.dx = 0.0;
  glyphs[0].metrics.dy = 0.0;
  glyphs[0].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  glyphs[0].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  indices[0] = (char_to_index)this;
  std::vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>::vector
            ((vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> *)
             &glyphs[0].metrics.dy);
  mocks::create_font<1ul,1ul>
            ((mocks *)local_b8,(font_metrics *)(anonymous_namespace)::c_fm1,
             (char_to_index (*) [1])&local_78,
             (glyph (*) [1])
             &f.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  peVar2 = std::__shared_ptr_access<agge::font,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<agge::font,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_b8);
  i.super__Node_iterator_base<std::pair<const_unsigned_int,_agge::glyph>,_true>._M_cur._4_4_ = 2;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_agge::glyph,_agge::knuth_hash,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_agge::glyph>_>_>
       ::find(&(peVar2->_glyphs).
               super_unordered_map<unsigned_int,_agge::glyph,_agge::knuth_hash,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_agge::glyph>_>_>
              ,(key_type *)
               ((long)&i.super__Node_iterator_base<std::pair<const_unsigned_int,_agge::glyph>,_true>
                       ._M_cur + 4));
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_agge::glyph,_agge::knuth_hash,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_agge::glyph>_>_>
       ::end(&(peVar2->_glyphs).
              super_unordered_map<unsigned_int,_agge::glyph,_agge::knuth_hash,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_agge::glyph>_>_>
            );
  bVar1 = std::__detail::operator!=(&local_28,&local_20);
  if (bVar1) {
    ppVar3 = std::__detail::_Node_iterator<std::pair<const_unsigned_int,_agge::glyph>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_unsigned_int,_agge::glyph>,_false,_true> *
                          )&local_20);
    local_1e8 = &ppVar3->second;
  }
  else {
    local_1e8 = font::load_glyph(peVar2,i.
                                        super__Node_iterator_base<std::pair<const_unsigned_int,_agge::glyph>,_true>
                                        ._M_cur._4_4_);
  }
  local_d0[0] = local_1e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_118,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/FontTests.cpp"
             ,&local_119);
  ut::LocationInfo::LocationInfo(&local_f8,&local_118,0x1f);
  ut::is_null<agge::glyph_const*>(local_d0,&local_f8);
  ut::LocationInfo::~LocationInfo(&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  peVar2 = std::__shared_ptr_access<agge::font,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<agge::font,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_b8);
  i_1.super__Node_iterator_base<std::pair<const_unsigned_int,_agge::glyph>,_true>._M_cur._4_4_ =
       0x277f;
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_agge::glyph,_agge::knuth_hash,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_agge::glyph>_>_>
       ::find(&(peVar2->_glyphs).
               super_unordered_map<unsigned_int,_agge::glyph,_agge::knuth_hash,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_agge::glyph>_>_>
              ,(key_type *)
               ((long)&i_1.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_agge::glyph>,_true>.
                       _M_cur + 4));
  local_48._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_agge::glyph,_agge::knuth_hash,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_agge::glyph>_>_>
       ::end(&(peVar2->_glyphs).
              super_unordered_map<unsigned_int,_agge::glyph,_agge::knuth_hash,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_agge::glyph>_>_>
            );
  bVar1 = std::__detail::operator!=(&local_48,&local_40);
  if (bVar1) {
    ppVar3 = std::__detail::_Node_iterator<std::pair<const_unsigned_int,_agge::glyph>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_unsigned_int,_agge::glyph>,_false,_true> *
                          )&local_40);
    local_218 = &ppVar3->second;
  }
  else {
    local_218 = font::load_glyph(peVar2,i_1.
                                        super__Node_iterator_base<std::pair<const_unsigned_int,_agge::glyph>,_true>
                                        ._M_cur._4_4_);
  }
  local_128 = local_218;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_170,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/FontTests.cpp"
             ,&local_171);
  ut::LocationInfo::LocationInfo(&local_150,&local_170,0x20);
  ut::is_null<agge::glyph_const*>(&local_128,&local_150);
  ut::LocationInfo::~LocationInfo(&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  peVar2 = std::__shared_ptr_access<agge::font,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<agge::font,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_b8);
  i_2.super__Node_iterator_base<std::pair<const_unsigned_int,_agge::glyph>,_true>._M_cur._4_4_ = 1;
  local_60._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_agge::glyph,_agge::knuth_hash,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_agge::glyph>_>_>
       ::find(&(peVar2->_glyphs).
               super_unordered_map<unsigned_int,_agge::glyph,_agge::knuth_hash,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_agge::glyph>_>_>
              ,(key_type *)
               ((long)&i_2.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_agge::glyph>,_true>.
                       _M_cur + 4));
  this_local = (FontTests *)
               std::
               unordered_map<unsigned_int,_agge::glyph,_agge::knuth_hash,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_agge::glyph>_>_>
               ::end(&(peVar2->_glyphs).
                      super_unordered_map<unsigned_int,_agge::glyph,_agge::knuth_hash,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_agge::glyph>_>_>
                    );
  bVar1 = std::__detail::operator!=
                    ((_Node_iterator_base<std::pair<const_unsigned_int,_agge::glyph>,_true> *)
                     &this_local,&local_60);
  if (bVar1) {
    ppVar3 = std::__detail::_Node_iterator<std::pair<const_unsigned_int,_agge::glyph>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_unsigned_int,_agge::glyph>,_false,_true> *
                          )&local_60);
    local_248 = &ppVar3->second;
  }
  else {
    local_248 = font::load_glyph(peVar2,i_2.
                                        super__Node_iterator_base<std::pair<const_unsigned_int,_agge::glyph>,_true>
                                        ._M_cur._4_4_);
  }
  local_180 = local_248;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1c8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/FontTests.cpp"
             ,&local_1c9);
  ut::LocationInfo::LocationInfo(&local_1a8,&local_1c8,0x21);
  ut::is_null<agge::glyph_const*>(&local_180,&local_1a8);
  ut::LocationInfo::~LocationInfo(&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  std::shared_ptr<agge::font>::~shared_ptr((shared_ptr<agge::font> *)local_b8);
  local_268 = (glyph *)&glyphs[0].outline.
                        super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  do {
    local_268 = local_268 + -1;
    mocks::font_accessor::glyph::~glyph(local_268);
  } while (local_268 !=
           (glyph *)&f.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

test( MissingGlyphIsReportedAsNull )
			{
				// INIT
				mocks::font_accessor::char_to_index indices[] = { { L'A', 0 }, };
				mocks::font_accessor::glyph glyphs[] = { { { 11, 0 } }, };
				font::ptr f = mocks::create_font(c_fm1, indices, glyphs);

				// ACT / ASSERT
				assert_null(f->get_glyph(2));
				assert_null(f->get_glyph(10111));
				assert_null(f->get_glyph(1));
			}